

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmatrix.cpp
# Opt level: O2

MatrixType __thiscall VMatrix::type(VMatrix *this)

{
  MatrixType MVar1;
  MatrixType MVar2;
  
  MVar2 = this->mType;
  MVar1 = this->dirty;
  if (MVar1 < MVar2 || MVar1 == None) {
    return MVar2;
  }
  switch(MVar1) {
  case Translate:
switchD_0011344d_caseD_1:
    MVar2 = Translate;
    if ((ABS(this->mtx) <= 1e-06) && (ABS(this->mty) <= 1e-06)) {
      MVar2 = None;
    }
    break;
  case Scale:
switchD_0011344d_caseD_2:
    MVar2 = Scale;
    if ((ABS(this->m11 + -1.0) <= 1e-06) && (ABS(this->m22 + -1.0) <= 1e-06))
    goto switchD_0011344d_caseD_1;
    break;
  case Scale|Translate:
  case Rotate|Translate:
  case Rotate|Scale:
  case Rotate|Scale|Translate:
    goto switchD_0011344d_caseD_3;
  case Rotate:
  case Shear:
switchD_0011344d_caseD_4:
    if ((ABS(this->m12) <= 1e-06) && (ABS(this->m21) <= 1e-06)) goto switchD_0011344d_caseD_2;
    MVar2 = (1e-06 < ABS(this->m12 * this->m11 + this->m21 * this->m22)) * '\x04' + Rotate;
    break;
  default:
    if (MVar1 != Project) goto switchD_0011344d_caseD_3;
    MVar2 = Project;
    if (((ABS(this->m13) <= 1e-06) && (ABS(this->m23) <= 1e-06)) && (ABS(this->m33 + -1.0) <= 1e-06)
       ) goto switchD_0011344d_caseD_4;
  }
  this->mType = MVar2;
switchD_0011344d_caseD_3:
  this->dirty = None;
  return MVar2;
}

Assistant:

VMatrix::MatrixType VMatrix::type() const
{
    if (dirty == MatrixType::None || dirty < mType) return mType;

    switch (dirty) {
    case MatrixType::Project:
        if (!vIsZero(m13) || !vIsZero(m23) || !vIsZero(m33 - 1)) {
            mType = MatrixType::Project;
            break;
        }
        VECTOR_FALLTHROUGH
    case MatrixType::Shear:
    case MatrixType::Rotate:
        if (!vIsZero(m12) || !vIsZero(m21)) {
            const float dot = m11 * m12 + m21 * m22;
            if (vIsZero(dot))
                mType = MatrixType::Rotate;
            else
                mType = MatrixType::Shear;
            break;
        }
        VECTOR_FALLTHROUGH
    case MatrixType::Scale:
        if (!vIsZero(m11 - 1) || !vIsZero(m22 - 1)) {
            mType = MatrixType::Scale;
            break;
        }
        VECTOR_FALLTHROUGH
    case MatrixType::Translate:
        if (!vIsZero(mtx) || !vIsZero(mty)) {
            mType = MatrixType::Translate;
            break;
        }